

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O3

void __thiscall FConfigFile::SetValueForKey(FConfigFile *this,char *key,char *value,bool duplicates)

{
  FConfigSection *section;
  int iVar1;
  FConfigSection *this_00;
  
  section = this->CurrentSection;
  if (section == (FConfigSection *)0x0) {
    return;
  }
  this_00 = section;
  if (!duplicates) {
    while (this_00 = (FConfigSection *)this_00->RootEntry, this_00 != (FConfigSection *)0x0) {
      this = (FConfigFile *)&this_00->LastEntryPtr;
      iVar1 = strcasecmp((char *)this,key);
      if (iVar1 == 0) {
        FConfigEntry::SetValue((FConfigEntry *)this_00,value);
        return;
      }
    }
  }
  NewConfigEntry(this,section,key,value);
  return;
}

Assistant:

void FConfigFile::SetValueForKey (const char *key, const char *value, bool duplicates)
{
	if (CurrentSection != NULL)
	{
		FConfigEntry *entry;

		if (duplicates || (entry = FindEntry (CurrentSection, key)) == NULL)
		{
			NewConfigEntry (CurrentSection, key, value);
		}
		else
		{
			entry->SetValue (value);
		}
	}
}